

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanomsg_reader.cc
# Opt level: O2

bool __thiscall NanomsgReader::nextPacket(NanomsgReader *this,array<unsigned_char,_892UL> *out)

{
  void *msg;
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  runtime_error *this_00;
  void *buf;
  string local_1d0 [32];
  stringstream ss;
  ostream local_1a0 [376];
  
  buf = (void *)0x0;
  do {
    iVar1 = nn_recv(this->fd_,&buf,0xffffffffffffffff,0);
    msg = buf;
    if (iVar1 < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar2 = std::operator<<(local_1a0,"nn_recv: ");
      iVar1 = nn_errno();
      pcVar3 = nn_strerror(iVar1);
      std::operator<<(poVar2,pcVar3);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1d0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  } while (iVar1 != 0x37c);
  memcpy(out,buf,0x37c);
  nn_freemsg(msg);
  return true;
}

Assistant:

bool NanomsgReader::nextPacket(std::array<uint8_t, 892>& out) {
  void* buf = nullptr;
  int nbytes;
  for (;;) {
    nbytes = nn_recv(fd_, &buf, NN_MSG, 0);
    if (nbytes < 0) {
      std::stringstream ss;
      ss << "nn_recv: " << nn_strerror(nn_errno());
      throw std::runtime_error(ss.str());
    }
    if (nbytes != (int) out.size()) {
      continue;
    }

    memcpy(out.data(), buf, nbytes);
    nn_freemsg(buf);
    return true;
  }
}